

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_bmrs.h
# Opt level: O0

void __thiscall BMRS<TTA>::SecondScan(BMRS<TTA> *this)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint64_t *puVar5;
  uint uVar6;
  uint *puVar7;
  uint *puVar8;
  int iVar9;
  uint local_6c;
  int j_1;
  int label_1;
  unsigned_short end_pos_1;
  unsigned_short start_pos_1;
  uint *labels;
  int j;
  int label;
  unsigned_short end_pos;
  unsigned_short start_pos;
  uint *labels_d;
  uint *labels_u;
  uint64_t *data_d;
  uint64_t *data_u;
  Run *pRStack_20;
  int i;
  Run *runs;
  int h;
  int w;
  BMRS<TTA> *this_local;
  
  iVar3 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x18);
  pRStack_20 = (this->data_runs).runs;
  for (data_u._4_4_ = 0; data_u._4_4_ < iVar3 / 2; data_u._4_4_ = data_u._4_4_ + 1) {
    puVar5 = (this->data_compressed).bits;
    iVar9 = (this->data_compressed).data_width * 2 * data_u._4_4_;
    iVar4 = (this->data_compressed).data_width;
    puVar7 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,data_u._4_4_ << 1);
    puVar8 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,data_u._4_4_ * 2 + 1);
    for (; uVar1 = pRStack_20->start_pos, uVar1 != 0xffff; pRStack_20 = pRStack_20 + 1) {
      uVar2 = pRStack_20->end_pos;
      uVar6 = TTA::GetLabel(pRStack_20->label);
      for (labels._4_4_ = (uint)uVar1; (int)labels._4_4_ < (int)(uint)uVar2;
          labels._4_4_ = labels._4_4_ + 1) {
        if ((puVar5[(long)iVar9 + (long)((int)labels._4_4_ >> 6)] &
            1L << ((byte)labels._4_4_ & 0x3f)) != 0) {
          puVar7[(int)labels._4_4_] = uVar6;
        }
        if ((puVar5[(long)iVar9 + (long)iVar4 + (long)((int)labels._4_4_ >> 6)] &
            1L << ((byte)labels._4_4_ & 0x3f)) != 0) {
          puVar8[(int)labels._4_4_] = uVar6;
        }
      }
    }
    pRStack_20 = pRStack_20 + 1;
  }
  if (iVar3 % 2 != 0) {
    puVar7 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,iVar3 + -1);
    for (; uVar1 = pRStack_20->start_pos, uVar1 != 0xffff; pRStack_20 = pRStack_20 + 1) {
      uVar2 = pRStack_20->end_pos;
      uVar6 = TTA::GetLabel(pRStack_20->label);
      for (local_6c = (uint)uVar1; (int)local_6c < (int)(uint)uVar2; local_6c = local_6c + 1) {
        puVar7[(int)local_6c] = uVar6;
      }
    }
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h / 2; i++) {
            const uint64_t* const data_u = data_compressed.bits + data_compressed.data_width * 2 * i;
            const uint64_t* const data_d = data_u + data_compressed.data_width;
            unsigned* const labels_u = img_labels_.ptr<unsigned>(2 * i);
            unsigned* const labels_d = img_labels_.ptr<unsigned>(2 * i + 1);

            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);

                for (int j = start_pos; j < end_pos; j++) {
                    if (data_u[j >> 6] & (1ull << (j & 0x3F))) labels_u[j] = label;
                    if (data_d[j >> 6] & (1ull << (j & 0x3F))) labels_d[j] = label;
                }
            }
        }
        if (h % 2) {
            unsigned* const labels = img_labels_.ptr<unsigned>(h - 1);
            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (int j = start_pos; j < end_pos; j++) {
                    labels[j] = label;
                }
            }
        }
    }